

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> * __thiscall
chaiscript::bootstrap::Bootstrap::
do_return_boxed_value_vector<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>(chaiscript::dispatch::Proxy_Function_Base::*)()const>
          (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
           *__return_storage_ptr__,Bootstrap *this,offset_in_Proxy_Function_Base_to_subr f,
          Proxy_Function_Base *b)

{
  bool bVar1;
  long *plVar2;
  Bootstrap *local_c0;
  value_type local_88;
  reference local_78;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *o;
  iterator __end0;
  iterator __begin0;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  *__range3;
  undefined1 local_50 [8];
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  v;
  Proxy_Function_Base *b_local;
  offset_in_Proxy_Function_Base_to_subr f_local;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *vbv;
  
  plVar2 = (long *)((long)&b->_vptr_Proxy_Function_Base + f);
  local_c0 = this;
  if (((ulong)this & 1) != 0) {
    local_c0 = *(Bootstrap **)(this + *plVar2 + -1);
  }
  v.
  super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)b;
  (*(code *)local_c0)(local_50,plVar2);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            (__return_storage_ptr__);
  __end0 = std::
           vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
           ::begin((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                    *)local_50);
  o = (shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)
      std::
      vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
      ::end((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
             *)local_50);
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                           (&__end0,(__normal_iterator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                                     *)&o), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_78 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>_>
               ::operator*(&__end0);
    const_var<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
              ((chaiscript *)&local_88,local_78);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::push_back
              (__return_storage_ptr__,&local_88);
    Boxed_Value::~Boxed_Value(&local_88);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>_>
    ::operator++(&__end0);
  }
  std::
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
             *)local_50);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Boxed_Value> do_return_boxed_value_vector(FunctionType f, const dispatch::Proxy_Function_Base *b) {
      auto v = (b->*f)();

      std::vector<Boxed_Value> vbv;

      for (const auto &o : v) {
        vbv.push_back(const_var(o));
      }

      return vbv;
    }